

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O0

bool __thiscall adios2::core::IO::RemoveAttribute(IO *this,string *name)

{
  bool bVar1;
  int iVar2;
  pointer pAVar3;
  DataType type;
  iterator itAttribute;
  bool isRemoved;
  ScopedTimer __var2385;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
  *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  in_stack_ffffffffffffff98;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_28;
  byte local_19;
  
  if ((RemoveAttribute(std::__cxx11::string_const&)::__var385 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&RemoveAttribute(std::__cxx11::string_const&)::__var385),
     iVar2 != 0)) {
    RemoveAttribute::__var385 = (void *)ps_timer_create_("IO::RemoveAttribute");
    __cxa_guard_release(&RemoveAttribute(std::__cxx11::string_const&)::__var385);
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  local_19 = 0;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
       ::find(in_stack_ffffffffffffff88,(key_type *)0x89d3ab);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
       ::end(in_stack_ffffffffffffff88);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                  *)0x89d3f1);
    pAVar3 = std::
             unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
             ::operator->((unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                           *)0x89d3fd);
    if (pAVar3->m_Type != None) {
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
      ::erase((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
               *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
              (iterator)in_stack_ffffffffffffff98._M_cur);
      local_19 = 1;
    }
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer
            ((ScopedTimer *)CONCAT17(local_19,in_stack_ffffffffffffff90));
  return (bool)(local_19 & 1);
}

Assistant:

bool IO::RemoveAttribute(const std::string &name) noexcept
{
    PERFSTUBS_SCOPED_TIMER("IO::RemoveAttribute");
    bool isRemoved = false;
    auto itAttribute = m_Attributes.find(name);
    // attribute exists
    if (itAttribute != m_Attributes.end())
    {
        // first remove the Attribute object
        const DataType type(itAttribute->second->m_Type);

        if (type == DataType::None)
        {
            // nothing to do
        }
        else
        {
            m_Attributes.erase(itAttribute);
            isRemoved = true;
        }
    }

    return isRemoved;
}